

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

void opj_write_float_LE(OPJ_BYTE *p_buffer,OPJ_FLOAT32 p_value)

{
  uint local_24;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 i;
  OPJ_BYTE *l_data_ptr;
  OPJ_BYTE *pOStack_10;
  OPJ_FLOAT32 p_value_local;
  OPJ_BYTE *p_buffer_local;
  
  pOStack_20 = (OPJ_BYTE *)((long)&l_data_ptr + 7);
  pOStack_10 = p_buffer;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    *pOStack_10 = *pOStack_20;
    pOStack_20 = pOStack_20 + -1;
    pOStack_10 = pOStack_10 + 1;
  }
  return;
}

Assistant:

void opj_write_float_LE(OPJ_BYTE * p_buffer, OPJ_FLOAT32 p_value)
{
    const OPJ_BYTE * l_data_ptr = ((const OPJ_BYTE *) &p_value) + sizeof(
                                      OPJ_FLOAT32) - 1;
    OPJ_UINT32 i;
    for (i = 0; i < sizeof(OPJ_FLOAT32); ++i) {
        *(p_buffer++) = *(l_data_ptr--);
    }
}